

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Finalize<duckdb::QuantileState<long,duckdb::QuantileStandardType>,long,duckdb::MedianAbsoluteDeviationOperation<long>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  AggregateFinalizeData *finalize_data_00;
  QuantileState<long,_duckdb::QuantileStandardType> *in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  long *in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  long *rdata_1;
  QuantileState<long,_duckdb::QuantileStandardType> **sdata_1;
  AggregateFinalizeData finalize_data;
  long *rdata;
  QuantileState<long,_duckdb::QuantileStandardType> **sdata;
  QuantileState<long,_duckdb::QuantileStandardType> *local_80;
  AggregateFinalizeData local_78;
  long *local_60;
  undefined8 in_stack_ffffffffffffffa8;
  VectorType vector_type_p;
  Vector *in_stack_ffffffffffffffb0;
  AggregateFinalizeData *in_stack_ffffffffffffffd0;
  
  vector_type_p = (VectorType)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    Vector::SetVectorType(in_stack_ffffffffffffffb0,vector_type_p);
    finalize_data_00 =
         (AggregateFinalizeData *)
         ConstantVector::GetData<duckdb::QuantileState<long,duckdb::QuantileStandardType>*>
                   ((Vector *)0x1dc7da0);
    ConstantVector::GetData<long>((Vector *)0x1dc7daf);
    AggregateFinalizeData::AggregateFinalizeData
              ((AggregateFinalizeData *)&stack0xffffffffffffffb0,in_RDX,in_RSI);
    MedianAbsoluteDeviationOperation<long>::
    Finalize<long,duckdb::QuantileState<long,duckdb::QuantileStandardType>>
              (in_RCX,in_R8,finalize_data_00);
  }
  else {
    Vector::SetVectorType(in_stack_ffffffffffffffb0,vector_type_p);
    FlatVector::GetData<duckdb::QuantileState<long,duckdb::QuantileStandardType>*>
              ((Vector *)0x1dc7dfd);
    local_60 = FlatVector::GetData<long>((Vector *)0x1dc7e0c);
    AggregateFinalizeData::AggregateFinalizeData(&local_78,in_RDX,in_RSI);
    for (local_80 = (QuantileState<long,_duckdb::QuantileStandardType> *)0x0; local_80 < in_RCX;
        local_80 = (QuantileState<long,_duckdb::QuantileStandardType> *)
                   ((long)&(local_80->v).super_vector<long,_std::allocator<long>_>.
                           super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start + 1)) {
      local_78.result_idx =
           (long)&(local_80->v).super_vector<long,_std::allocator<long>_>.
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                  _M_start + (long)in_R8;
      MedianAbsoluteDeviationOperation<long>::
      Finalize<long,duckdb::QuantileState<long,duckdb::QuantileStandardType>>
                (in_RCX,in_R8,in_stack_ffffffffffffffd0);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}